

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O1

void __thiscall Rml::ElementFormControl::SetDisabled(ElementFormControl *this,bool disable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined7 in_register_00000031;
  String local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  if ((int)CONCAT71(in_register_00000031,disable) == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"disabled","");
    Element::RemoveAttribute(&this->super_Element,&local_30);
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"disabled","");
    Element::SetAttribute<char[1]>(&this->super_Element,&local_30,(char (*) [1])0x2e2a1c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ElementFormControl::SetDisabled(bool disable)
{
	if (disable)
		SetAttribute("disabled", "");
	else
		RemoveAttribute("disabled");
}